

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O2

void teleds(int nux,int nuy,boolean allow_drag)

{
  byte bVar1;
  bool bVar2;
  monst *pmVar3;
  bool bVar4;
  byte bVar5;
  boolean bVar6;
  int iVar7;
  xchar x;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  xchar local_44;
  xchar chainy;
  xchar chainx;
  xchar bally;
  xchar ballx;
  boolean cause_delay;
  uint local_38;
  int bc_control;
  
  uVar8 = (ulong)(uint)nux;
  uVar9 = (ulong)(uint)nux;
  if (uball == (obj *)0x0) {
    uVar8 = 0;
    bVar2 = false;
LAB_00247cae:
    bVar1 = 0;
  }
  else {
    if (uball->where == '\0') {
      uVar8 = 0;
      bVar2 = false;
      goto LAB_00247cae;
    }
    if (uball->where == '\x03') {
LAB_00247c75:
      if (allow_drag != '\0') {
        uVar8 = (ulong)(uint)(int)u.ux;
        iVar7 = distmin((int)u.ux,(int)u.uy,nux,nuy);
        if (iVar7 < 2) {
          uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
          bVar1 = 0;
          bVar2 = true;
          goto LAB_00247cb1;
        }
      }
      unplacebc();
      uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
      allow_drag = '\0';
      bVar2 = true;
      goto LAB_00247cae;
    }
    iVar7 = distmin(nux,nuy,(int)uball->ox,(int)uball->oy);
    uVar8 = CONCAT71((int7)(uVar9 >> 8),1);
    if (2 < iVar7) goto LAB_00247c75;
    bVar2 = true;
    bVar1 = 1;
  }
LAB_00247cb1:
  u.utrap = 0;
  u.ustuck = (monst *)0x0;
  u.ux0 = u.ux;
  u.uy0 = u.uy;
  if (((youmonst.data)->mflags1 & 0x80) == 0) {
    if ((youmonst.data)->mlet != '9') {
      u._1052_1_ = u._1052_1_ & 0x7b;
      if ((youmonst.data)->mlet == '\r') {
        youmonst.m_ap_type = '\0';
      }
      goto LAB_00247d5d;
    }
    local_38 = (uint)uVar8;
    u._1052_1_ = u._1052_1_ & 0x7f;
    bVar5 = is_pool(level,nux,nuy);
    uVar8 = (ulong)local_38;
    bVar10 = (bool)(bVar5 & 1);
    bVar5 = u._1052_1_ & 0xfb;
  }
  else {
    bVar10 = level->objects[nux][nuy] != (obj *)0x0;
    bVar5 = u._1052_1_ & 0x7b;
  }
  u._1052_1_ = bVar5 | bVar10 << 2;
LAB_00247d5d:
  if ((u._1052_1_ & 1) != 0) {
    u._1052_1_ = u._1052_1_ & 0xfe;
    u.uswldtim = 0;
    bVar10 = (char)uVar8 == '\0';
    if (bVar10 && uball != (obj *)0x0) {
      allow_drag = '\0';
    }
    bVar4 = true;
    if (!bVar10 || uball == (obj *)0x0) {
      bVar4 = bVar2;
    }
    bVar2 = bVar4;
    doredraw();
  }
  bVar10 = (bool)(bVar1 | allow_drag != '\0');
  x = (xchar)nux;
  local_44 = (xchar)nuy;
  if ((bool)(bVar2 & bVar10)) {
    bVar6 = drag_ball(x,local_44,&bc_control,&ballx,&bally,&chainx,&chainy,&cause_delay,allow_drag);
    if (bVar6 != '\0') {
      move_bc(0,bc_control,ballx,bally,chainx,chainy);
    }
  }
  u.uy = local_44;
  u.ux = x;
  fill_pit(level,(int)u.ux0,(int)u.uy0);
  if (bVar2 && !bVar10) {
    placebc();
  }
  initrack();
  update_player_regions(level);
  pmVar3 = u.usteed;
  if (u.usteed != (monst *)0x0) {
    (u.usteed)->mx = x;
    pmVar3->my = local_44;
  }
  newsym((int)u.ux0,(int)u.uy0);
  see_monsters();
  vision_full_recalc = '\x01';
  nomul(0,(char *)0x0);
  vision_recalc(0);
  spoteffects('\x01');
  invocation_message();
  return;
}

Assistant:

void teleds(int nux, int nuy, boolean allow_drag)
{
	boolean ball_active = (Punished && uball->where != OBJ_FREE),
		ball_still_in_range = FALSE;

	/* If they have to move the ball, then drag if allow_drag is true;
	 * otherwise they are teleporting, so unplacebc().  
	 * If they don't have to move the ball, then always "drag" whether or
	 * not allow_drag is true, because we are calling that function, not
	 * to drag, but to move the chain.  *However* there are some dumb
	 * special cases:
	 *    0				 0
	 *   _X  move east       ----->  X_
	 *    @				  @
	 * These are permissible if teleporting, but not if dragging.  As a
	 * result, drag_ball() needs to know about allow_drag and might end
	 * up dragging the ball anyway.  Also, drag_ball() might find that
	 * dragging the ball is completely impossible (ball in range but there's
	 * rock in the way), in which case it teleports the ball on its own.
	 */
	if (ball_active) {
	    if (!carried(uball) && distmin(nux, nuy, uball->ox, uball->oy) <= 2)
		ball_still_in_range = TRUE; /* don't have to move the ball */
	    else {
		/* have to move the ball */
		if (!allow_drag || distmin(u.ux, u.uy, nux, nuy) > 1) {
		    /* we should not have dist > 1 and allow_drag at the same
		     * time, but just in case, we must then revert to teleport.
		     */
		    allow_drag = FALSE;
		    unplacebc();
		}
	    }
	}
	u.utrap = 0;
	u.ustuck = 0;
	u.uwilldrown = 0;
	u.ux0 = u.ux;
	u.uy0 = u.uy;

	if (hides_under(youmonst.data))
		u.uundetected = OBJ_AT(nux, nuy);
	else if (youmonst.data->mlet == S_EEL)
		u.uundetected = is_pool(level, nux, nuy);
	else {
		u.uundetected = 0;
		/* mimics stop being unnoticed */
		if (youmonst.data->mlet == S_MIMIC)
		    youmonst.m_ap_type = M_AP_NOTHING;
	}

	if (u.uswallow) {
		u.uswldtim = u.uswallow = 0;
		if (Punished && !ball_active) {
		    /* ensure ball placement, like unstuck */
		    ball_active = TRUE;
		    allow_drag = FALSE;
		}
		doredraw();
	}
	if (ball_active) {
	    if (ball_still_in_range || allow_drag) {
		int bc_control;
		xchar ballx, bally, chainx, chainy;
		boolean cause_delay;

		if (drag_ball(nux, nuy, &bc_control, &ballx, &bally,
				    &chainx, &chainy, &cause_delay, allow_drag))
		    move_bc(0, bc_control, ballx, bally, chainx, chainy);
	    }
	}
	/* must set u.ux, u.uy after drag_ball(), which may need to know
	   the old position if allow_drag is true... */
	u.ux = nux;
	u.uy = nuy;
	fill_pit(level, u.ux0, u.uy0);
	if (ball_active) {
	    if (!ball_still_in_range && !allow_drag)
		placebc();
	}
	initrack(); /* teleports mess up tracking monsters without this */
	update_player_regions(level);
	/* Move your steed, too */
	if (u.usteed) {
		u.usteed->mx = nux;
		u.usteed->my = nuy;
	}

	/*
	 *  Make sure the hero disappears from the old location.  This will
	 *  not happen if she is teleported within sight of her previous
	 *  location.  Force a full vision recalculation because the hero
	 *  is now in a new location.
	 */
	newsym(u.ux0,u.uy0);
	see_monsters();
	vision_full_recalc = 1;
	nomul(0, NULL);
	vision_recalc(0);	/* vision before effects */
	spoteffects(TRUE);
	invocation_message();
}